

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O1

vector<crnlib::vector<unsigned_int>_> * __thiscall
crnlib::vector<crnlib::vector<unsigned_int>_>::operator=
          (vector<crnlib::vector<unsigned_int>_> *this,vector<crnlib::vector<unsigned_int>_> *other)

{
  undefined8 *puVar1;
  uint uVar2;
  vector<unsigned_int> *pvVar3;
  void *pvVar4;
  vector<unsigned_int> *pvVar5;
  uint uVar6;
  long lVar7;
  
  if (this != other) {
    if (this->m_capacity < other->m_size) {
      pvVar3 = this->m_p;
      if (pvVar3 != (vector<unsigned_int> *)0x0) {
        uVar2 = this->m_size;
        if ((ulong)uVar2 != 0) {
          lVar7 = 0;
          do {
            pvVar4 = *(void **)((long)&pvVar3->m_p + lVar7);
            if (pvVar4 != (void *)0x0) {
              crnlib_free(pvVar4);
            }
            lVar7 = lVar7 + 0x10;
          } while ((ulong)uVar2 << 4 != lVar7);
        }
        crnlib_free(this->m_p);
        this->m_p = (vector<unsigned_int> *)0x0;
        this->m_size = 0;
        this->m_capacity = 0;
      }
      elemental_vector::increase_capacity
                ((elemental_vector *)this,other->m_size,false,0x10,(object_mover)0x0,false);
    }
    else {
      uVar2 = this->m_size;
      if ((ulong)uVar2 != 0) {
        pvVar3 = this->m_p;
        lVar7 = 0;
        do {
          pvVar4 = *(void **)((long)&pvVar3->m_p + lVar7);
          if (pvVar4 != (void *)0x0) {
            crnlib_free(pvVar4);
          }
          lVar7 = lVar7 + 0x10;
        } while ((ulong)uVar2 << 4 != lVar7);
        this->m_size = 0;
      }
    }
    uVar6 = other->m_size;
    if (uVar6 != 0) {
      pvVar3 = other->m_p;
      pvVar5 = this->m_p;
      lVar7 = 0;
      do {
        puVar1 = (undefined8 *)((long)&pvVar5->m_p + lVar7);
        *puVar1 = 0;
        puVar1[1] = 0;
        elemental_vector::increase_capacity
                  ((elemental_vector *)((long)&pvVar5->m_p + lVar7),
                   *(uint *)((long)&pvVar3->m_size + lVar7),false,4,(object_mover)0x0,false);
        uVar2 = *(uint *)((long)&pvVar3->m_size + lVar7);
        *(uint *)((long)&pvVar5->m_size + lVar7) = uVar2;
        memcpy(*(void **)((long)&pvVar5->m_p + lVar7),*(void **)((long)&pvVar3->m_p + lVar7),
               (ulong)uVar2 << 2);
        lVar7 = lVar7 + 0x10;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
    this->m_size = other->m_size;
  }
  return this;
}

Assistant:

inline vector& operator=(const vector& other)
        {
            if (this == &other)
            {
                return *this;
            }

            if (m_capacity >= other.m_size)
            {
                resize(0);
            }
            else
            {
                clear();
                increase_capacity(other.m_size, false);
            }

            if (CRNLIB_IS_BITWISE_COPYABLE(T))
            {
                memcpy(m_p, other.m_p, other.m_size * sizeof(T));
            }
            else
            {
                T* pDst = m_p;
                const T* pSrc = other.m_p;
                for (uint i = other.m_size; i > 0; i--)
                {
                    helpers::construct(pDst++, *pSrc++);
                }
            }

            m_size = other.m_size;

            return *this;
        }